

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t find_last_nonempty_line(Terminal *term,tree234 *screen)

{
  uint uVar1;
  unsigned_long bchr;
  unsigned_long battr;
  _Bool _Var2;
  wchar_t wVar3;
  void *pvVar4;
  wchar_t index;
  termchar *a;
  uint uVar5;
  ulong uVar6;
  
  wVar3 = count234(screen);
  do {
    index = wVar3 + L'\xffffffff';
    if (wVar3 < L'\x01') {
      return index;
    }
    pvVar4 = index234(screen,index);
    uVar1 = *(uint *)((long)pvVar4 + 4);
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    else {
      a = *(termchar **)((long)pvVar4 + 0x18);
      bchr = (term->erase_char).chr;
      battr = (term->erase_char).attr;
      uVar6 = 0;
      do {
        _Var2 = termchars_equal_override(a,&term->erase_char,bchr,battr);
        if (!_Var2) goto LAB_0010a81d;
        uVar6 = uVar6 + 1;
        a = a + 1;
      } while (uVar1 != uVar6);
      uVar6 = (ulong)uVar1;
LAB_0010a81d:
      uVar5 = (uint)uVar6;
    }
    wVar3 = index;
    if (uVar5 != uVar1) {
      return index;
    }
  } while( true );
}

Assistant:

static int find_last_nonempty_line(Terminal * term, tree234 * screen)
{
    int i;
    for (i = count234(screen) - 1; i >= 0; i--) {
        termline *line = index234(screen, i);
        int j;
        for (j = 0; j < line->cols; j++)
            if (!termchars_equal(&line->chars[j], &term->erase_char))
                break;
        if (j != line->cols) break;
    }
    return i;
}